

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_btlazy2_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *ip;
  BYTE *iEnd;
  BYTE *pBVar1;
  ZSTD_matchState_t *pZVar2;
  int iVar3;
  undefined8 uVar4;
  seqStore_t *psVar5;
  uint uVar6;
  size_t sVar7;
  size_t sVar8;
  uint uVar9;
  U32 UVar10;
  BYTE *pBVar11;
  size_t sVar12;
  BYTE *litEnd;
  ulong uVar13;
  int *piVar14;
  int *piVar15;
  BYTE *pBVar16;
  BYTE *pBVar17;
  long lVar18;
  int *piVar19;
  seqDef *psVar20;
  size_t offsetFound;
  BYTE *litLimit_w;
  U32 local_b0;
  U32 local_ac;
  size_t local_a0;
  ulong local_98;
  uint local_8c;
  int *local_88;
  BYTE *local_80;
  BYTE *local_78;
  BYTE *local_70;
  int *local_68;
  BYTE *local_60;
  ZSTD_matchState_t *local_58;
  seqStore_t *local_50;
  BYTE *local_48;
  U32 *local_40;
  BYTE *local_38;
  
  iEnd = (BYTE *)((long)src + srcSize);
  local_88 = (int *)((long)src + (srcSize - 8));
  local_78 = (ms->window).base;
  local_8c = (ms->window).dictLimit;
  local_98 = (ulong)local_8c;
  local_80 = local_78 + local_98;
  local_b0 = *rep;
  pZVar2 = ms->dictMatchState;
  local_70 = (pZVar2->window).nextSrc;
  local_60 = (pZVar2->window).base;
  local_38 = local_60 + (pZVar2->window).dictLimit;
  local_ac = rep[1];
  piVar19 = (int *)((ulong)(((int)src - ((int)local_38 + (int)local_80)) + (int)local_70 == 0) +
                   (long)src);
  if (piVar19 < local_88) {
    local_8c = ((int)local_60 - (int)local_70) + local_8c;
    local_48 = local_60 + -(ulong)local_8c;
    local_68 = (int *)(iEnd + -0x20);
    local_58 = ms;
    local_50 = seqStore;
    local_40 = rep;
    do {
      uVar6 = (((int)piVar19 - (int)local_78) - local_b0) + 1;
      uVar9 = (uint)local_98;
      piVar14 = (int *)(local_78 + uVar6);
      if (uVar6 < uVar9) {
        piVar14 = (int *)(local_60 + (uVar6 - local_8c));
      }
      if ((uVar6 - uVar9 < 0xfffffffd) && (*piVar14 == *(int *)((long)piVar19 + 1))) {
        pBVar11 = iEnd;
        if (uVar6 < uVar9) {
          pBVar11 = local_70;
        }
        sVar7 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar19 + 5),(BYTE *)(piVar14 + 1),iEnd,pBVar11,local_80);
        uVar13 = sVar7 + 4;
      }
      else {
        uVar13 = 0;
      }
      local_a0 = 999999999;
      sVar8 = ZSTD_BtFindBestMatch_dictMatchState_selectMLS(local_58,(BYTE *)piVar19,iEnd,&local_a0)
      ;
      sVar7 = uVar13;
      if (uVar13 < sVar8) {
        sVar7 = sVar8;
      }
      if (sVar7 < 4) {
        piVar19 = (int *)((long)piVar19 + ((long)piVar19 - (long)src >> 8) + 1);
      }
      else {
        piVar14 = piVar19;
        sVar12 = local_a0;
        if (sVar8 <= uVar13) {
          piVar14 = (int *)((long)piVar19 + 1);
          sVar12 = 0;
        }
        if (piVar19 < local_88) {
          do {
            ip = (int *)((long)piVar19 + 1);
            uVar6 = ((int)ip - (int)local_78) - local_b0;
            uVar9 = (uint)local_98;
            piVar15 = (int *)(local_78 + uVar6);
            if (uVar6 < uVar9) {
              piVar15 = (int *)(local_60 + (uVar6 - local_8c));
            }
            if ((uVar6 - uVar9 < 0xfffffffd) && (*piVar15 == *ip)) {
              pBVar11 = iEnd;
              if (uVar6 < uVar9) {
                pBVar11 = local_70;
              }
              sVar8 = ZSTD_count_2segments
                                ((BYTE *)((long)piVar19 + 5),(BYTE *)(piVar15 + 1),iEnd,pBVar11,
                                 local_80);
              if (sVar8 < 0xfffffffffffffffc) {
                uVar9 = (int)sVar12 + 1;
                uVar6 = 0x1f;
                if (uVar9 != 0) {
                  for (; uVar9 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                  }
                }
                if ((int)((uVar6 ^ 0x1f) + (int)sVar7 * 3 + -0x1e) < (int)(sVar8 + 4) * 3) {
                  sVar12 = 0;
                  piVar14 = ip;
                  sVar7 = sVar8 + 4;
                }
              }
            }
            local_a0 = 999999999;
            sVar8 = ZSTD_BtFindBestMatch_dictMatchState_selectMLS
                              (local_58,(BYTE *)ip,iEnd,&local_a0);
            if (sVar8 < 4) {
LAB_006e6b84:
              if (local_88 <= ip) break;
              ip = (int *)((long)piVar19 + 2);
              uVar6 = ((int)ip - (int)local_78) - local_b0;
              uVar9 = (uint)local_98;
              piVar15 = (int *)(local_78 + uVar6);
              if (uVar6 < uVar9) {
                piVar15 = (int *)(local_60 + (uVar6 - local_8c));
              }
              if ((uVar6 - uVar9 < 0xfffffffd) && (*piVar15 == *ip)) {
                pBVar11 = iEnd;
                if (uVar6 < uVar9) {
                  pBVar11 = local_70;
                }
                sVar8 = ZSTD_count_2segments
                                  ((BYTE *)((long)piVar19 + 6),(BYTE *)(piVar15 + 1),iEnd,pBVar11,
                                   local_80);
                if (sVar8 < 0xfffffffffffffffc) {
                  uVar9 = (int)sVar12 + 1;
                  uVar6 = 0x1f;
                  if (uVar9 != 0) {
                    for (; uVar9 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                    }
                  }
                  if ((int)((uVar6 ^ 0x1f) + (int)sVar7 * 4 + -0x1e) < (int)(sVar8 + 4) * 4) {
                    sVar12 = 0;
                    piVar14 = ip;
                    sVar7 = sVar8 + 4;
                  }
                }
              }
              local_a0 = 999999999;
              sVar8 = ZSTD_BtFindBestMatch_dictMatchState_selectMLS
                                (local_58,(BYTE *)ip,iEnd,&local_a0);
              if (sVar8 < 4) break;
              uVar9 = (int)sVar12 + 1;
              uVar6 = 0x1f;
              if (uVar9 != 0) {
                for (; uVar9 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                }
              }
              uVar9 = (int)local_a0 + 1;
              iVar3 = 0x1f;
              if (uVar9 != 0) {
                for (; uVar9 >> iVar3 == 0; iVar3 = iVar3 + -1) {
                }
              }
              if ((int)sVar8 * 4 - iVar3 <= (int)((uVar6 ^ 0x1f) + (int)sVar7 * 4 + -0x18)) break;
            }
            else {
              uVar9 = (int)sVar12 + 1;
              uVar6 = 0x1f;
              if (uVar9 != 0) {
                for (; uVar9 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                }
              }
              uVar9 = (int)local_a0 + 1;
              iVar3 = 0x1f;
              if (uVar9 != 0) {
                for (; uVar9 >> iVar3 == 0; iVar3 = iVar3 + -1) {
                }
              }
              if ((int)sVar8 * 4 - iVar3 <= (int)((uVar6 ^ 0x1f) + (int)sVar7 * 4 + -0x1b))
              goto LAB_006e6b84;
            }
            piVar14 = ip;
            sVar7 = sVar8;
            sVar12 = local_a0;
            piVar19 = piVar14;
          } while (piVar14 < local_88);
        }
        psVar5 = local_50;
        if (sVar12 == 0) {
          UVar10 = 1;
        }
        else {
          pBVar16 = (BYTE *)((long)piVar14 + (-(long)local_78 - sVar12) + -0xfffffffe);
          pBVar17 = local_78;
          pBVar11 = local_80;
          if ((uint)pBVar16 < (uint)local_98) {
            pBVar17 = local_48;
            pBVar11 = local_38;
          }
          if ((src < piVar14) && (uVar13 = (ulong)pBVar16 & 0xffffffff, pBVar11 < pBVar17 + uVar13))
          {
            pBVar17 = pBVar17 + uVar13;
            do {
              pBVar17 = pBVar17 + -1;
              piVar19 = (int *)((long)piVar14 + -1);
              if ((*(BYTE *)piVar19 != *pBVar17) ||
                 (sVar7 = sVar7 + 1, piVar14 = piVar19, piVar19 <= src)) break;
            } while (pBVar11 < pBVar17);
          }
          local_ac = local_b0;
          local_b0 = (int)sVar12 - 2;
          UVar10 = (int)sVar12 + 1;
        }
        uVar13 = (long)piVar14 - (long)src;
        pBVar11 = local_50->lit;
        if (local_68 < piVar14) {
          piVar19 = (int *)src;
          pBVar17 = pBVar11;
          if (src <= local_68) {
            pBVar17 = pBVar11 + ((long)local_68 - (long)src);
            uVar4 = *(undefined8 *)((long)src + 8);
            *(undefined8 *)pBVar11 = *src;
            *(undefined8 *)(pBVar11 + 8) = uVar4;
            piVar19 = local_68;
            if (0x10 < (long)local_68 - (long)src) {
              lVar18 = 0x10;
              do {
                uVar4 = *(undefined8 *)((BYTE *)((long)src + lVar18) + 8);
                pBVar16 = pBVar11 + lVar18;
                *(undefined8 *)pBVar16 = *(undefined8 *)((long)src + lVar18);
                *(undefined8 *)(pBVar16 + 8) = uVar4;
                pBVar1 = (BYTE *)((long)src + lVar18 + 0x10);
                uVar4 = *(undefined8 *)(pBVar1 + 8);
                *(undefined8 *)(pBVar16 + 0x10) = *(undefined8 *)pBVar1;
                *(undefined8 *)(pBVar16 + 0x18) = uVar4;
                lVar18 = lVar18 + 0x20;
              } while (pBVar16 + 0x20 < pBVar17);
            }
          }
          if (piVar19 < piVar14) {
            lVar18 = 0;
            do {
              pBVar17[lVar18] = *(BYTE *)((long)piVar19 + lVar18);
              lVar18 = lVar18 + 1;
            } while ((long)piVar14 - (long)piVar19 != lVar18);
          }
LAB_006e6e41:
          local_50->lit = local_50->lit + uVar13;
          psVar20 = local_50->sequences;
          if (0xffff < uVar13) {
            local_50->longLengthType = ZSTD_llt_literalLength;
            local_50->longLengthPos =
                 (U32)((ulong)((long)psVar20 - (long)local_50->sequencesStart) >> 3);
          }
        }
        else {
          uVar4 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar11 = *src;
          *(undefined8 *)(pBVar11 + 8) = uVar4;
          pBVar11 = local_50->lit;
          if (0x10 < uVar13) {
            uVar4 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar11 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar11 + 0x18) = uVar4;
            if (0x20 < (long)uVar13) {
              lVar18 = 0;
              do {
                pBVar16 = (BYTE *)((long)src + lVar18 + 0x20);
                uVar4 = *(undefined8 *)(pBVar16 + 8);
                pBVar17 = pBVar11 + lVar18 + 0x20;
                *(undefined8 *)pBVar17 = *(undefined8 *)pBVar16;
                *(undefined8 *)(pBVar17 + 8) = uVar4;
                pBVar16 = (BYTE *)((long)src + lVar18 + 0x30);
                uVar4 = *(undefined8 *)(pBVar16 + 8);
                *(undefined8 *)(pBVar17 + 0x10) = *(undefined8 *)pBVar16;
                *(undefined8 *)(pBVar17 + 0x18) = uVar4;
                lVar18 = lVar18 + 0x20;
              } while (pBVar17 + 0x20 < pBVar11 + uVar13);
            }
            goto LAB_006e6e41;
          }
          local_50->lit = pBVar11 + uVar13;
          psVar20 = local_50->sequences;
        }
        psVar20->litLength = (U16)uVar13;
        psVar20->offset = UVar10;
        if (0xffff < sVar7 - 3) {
          local_50->longLengthType = ZSTD_llt_matchLength;
          local_50->longLengthPos =
               (U32)((ulong)((long)psVar20 - (long)local_50->sequencesStart) >> 3);
        }
        psVar20->matchLength = (U16)(sVar7 - 3);
        psVar20 = psVar20 + 1;
        local_50->sequences = psVar20;
        src = (void *)((long)piVar14 + sVar7);
        piVar19 = (int *)src;
        if (src <= local_88) {
          do {
            UVar10 = local_ac;
            uVar6 = ((int)src - (int)local_78) - UVar10;
            uVar9 = (uint)local_98;
            pBVar11 = local_78;
            if (uVar6 < uVar9) {
              pBVar11 = local_48;
            }
            piVar19 = (int *)src;
            local_ac = UVar10;
            if ((0xfffffffc < uVar6 - uVar9) || (*(int *)(pBVar11 + uVar6) != *src)) break;
            pBVar17 = iEnd;
            if (uVar6 < uVar9) {
              pBVar17 = local_70;
            }
            sVar7 = ZSTD_count_2segments
                              ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar11 + uVar6) + 4),iEnd,
                               pBVar17,local_80);
            if (src <= local_68) {
              pBVar11 = psVar5->lit;
              uVar4 = *(undefined8 *)((long)src + 8);
              *(undefined8 *)pBVar11 = *src;
              *(undefined8 *)(pBVar11 + 8) = uVar4;
              psVar20 = psVar5->sequences;
            }
            psVar20->litLength = 0;
            psVar20->offset = 1;
            if (0xffff < sVar7 + 1) {
              psVar5->longLengthType = ZSTD_llt_matchLength;
              psVar5->longLengthPos =
                   (U32)((ulong)((long)psVar20 - (long)psVar5->sequencesStart) >> 3);
            }
            psVar20->matchLength = (U16)(sVar7 + 1);
            psVar20 = psVar20 + 1;
            psVar5->sequences = psVar20;
            src = (void *)((long)src + sVar7 + 4);
            piVar19 = (int *)src;
            local_ac = local_b0;
            local_b0 = UVar10;
          } while (src <= local_88);
        }
      }
      rep = local_40;
    } while (piVar19 < local_88);
  }
  *rep = local_b0;
  rep[1] = local_ac;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2, ZSTD_dictMatchState);
}